

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

byte * __thiscall
Js::InterpreterStackFrame::OP_ProfiledLoopEnd<(Js::LayoutSize)0,true>
          (InterpreterStackFrame *this,byte *ip)

{
  code *pcVar1;
  bool bVar2;
  uint loopNumber_00;
  OpLayoutT_Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *pOVar3;
  FunctionBody *pFVar4;
  DynamicProfileInfo *pDVar5;
  undefined4 *puVar6;
  ScriptContext *this_00;
  ThreadContext *this_01;
  ThreadContext *threadContext;
  FunctionBody *fn;
  byte *pbStack_18;
  uint32 loopNumber;
  byte *ip_local;
  InterpreterStackFrame *this_local;
  
  pbStack_18 = ip;
  ip_local = (byte *)this;
  pOVar3 = ByteCodeReader::
           GetLayout<Js::OpLayoutT_Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
                     ((ByteCodeReader *)this,&stack0xffffffffffffffe8);
  loopNumber_00 = (uint)pOVar3->C1;
  CheckIfLoopIsHot(this,*(uint *)(this + 0xd0));
  pFVar4 = JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(this + 0x80));
  bVar2 = FunctionBody::HasDynamicProfileInfo(pFVar4);
  if (bVar2) {
    pDVar5 = FunctionBody::GetAnyDynamicProfileInfo(pFVar4);
    DynamicProfileInfo::SetLoopInterpreted(pDVar5,loopNumber_00);
    if ((DAT_01eafd40 <= *(uint *)(this + 0xd0)) ||
       ((*(int *)(this + 0xd0) == 0 &&
        (bVar2 = FunctionBody::DoJITLoopBody(*(FunctionBody **)(this + 0x88)), !bVar2)))) {
      pDVar5 = FunctionBody::GetAnyDynamicProfileInfo(pFVar4);
      DynamicProfileInfo::SetMemOpMinReached(pDVar5,loopNumber_00);
    }
  }
  *(undefined4 *)(this + 0xd0) = 0;
  pFVar4 = GetFunctionBody(this);
  bVar2 = DynamicProfileInfo::EnableImplicitCallFlags(pFVar4);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x16ed,
                                "(Js::DynamicProfileInfo::EnableImplicitCallFlags(GetFunctionBody()))"
                                ,
                                "Js::DynamicProfileInfo::EnableImplicitCallFlags(GetFunctionBody())"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  OP_RecordImplicitCall(this,loopNumber_00);
  if (*(uint *)(this + 0xd8) == loopNumber_00) {
    if (((byte)this[0xd6] >> 3 & 1) != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x16f3,"(!switchProfileMode)","!switchProfileMode");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    this[0xd6] = (InterpreterStackFrame)((byte)this[0xd6] & 0xf7 | 8);
    *(undefined4 *)(this + 0xd8) = 0xffffffff;
  }
  this_00 = GetScriptContext(this);
  this_01 = ScriptContext::GetThreadContext(this_00);
  ThreadContext::AddImplicitCallFlags
            (this_01,*(ImplicitCallFlags *)(*(long *)(this + 0xc0) + (ulong)loopNumber_00));
  ThreadContext::DecrementLoopDepth(this_01);
  return pbStack_18;
}

Assistant:

const byte * InterpreterStackFrame::OP_ProfiledLoopEnd(const byte * ip)
    {
        uint32 loopNumber = m_reader.GetLayout<OpLayoutT_Unsigned1<LayoutSizePolicy<layoutSize>>>(ip)->C1;
        if (!profiled && !isAutoProfiling)
        {
            return ip;
        }

        this->CheckIfLoopIsHot(this->currentLoopCounter);
        Js::FunctionBody *fn = this->function->GetFunctionBody();
        if (fn->HasDynamicProfileInfo())
        {
            fn->GetAnyDynamicProfileInfo()->SetLoopInterpreted(loopNumber);
            // If the counter is 0, there is a high chance that some config disabled tracking that information. (ie: -off:jitloopbody)
            // Assume it is valid for memop in this case.
            if (this->currentLoopCounter >= (uint)CONFIG_FLAG(MinMemOpCount) ||
                (this->currentLoopCounter == 0 && !this->m_functionBody->DoJITLoopBody())
                )
            {
                // This flag becomes relevant only if the loop has been interpreted
                fn->GetAnyDynamicProfileInfo()->SetMemOpMinReached(loopNumber);
            }
        }

        this->currentLoopCounter = 0;

        if (profiled)
        {
            Assert(Js::DynamicProfileInfo::EnableImplicitCallFlags(GetFunctionBody()));
            OP_RecordImplicitCall(loopNumber);

            if (switchProfileModeOnLoopEndNumber == loopNumber)
            {
                // Stop profiling since the jitted loop body would be exiting the loop
                Assert(!switchProfileMode);
                switchProfileMode = true;
                switchProfileModeOnLoopEndNumber = 0u - 1;
            }
        }

        // Restore the implicit call flags state and add with flags in the loop as well
        ThreadContext *const threadContext = GetScriptContext()->GetThreadContext();
        threadContext->AddImplicitCallFlags(this->savedLoopImplicitCallFlags[loopNumber]);

        threadContext->DecrementLoopDepth();
        return ip;
    }